

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftwareDriver2_helper.h
# Opt level: O2

void irr::memset16(void *dest,u16 value,size_t bytesize)

{
  ulong uVar1;
  undefined2 in_register_00000032;
  u16 *d;
  bool bVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  
  uVar1 = bytesize >> 4;
  auVar4 = pshuflw(ZEXT416(CONCAT22(in_register_00000032,value)),
                   ZEXT416(CONCAT22(in_register_00000032,value)),0);
  uVar3 = auVar4._0_4_;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    *(undefined4 *)dest = uVar3;
    *(undefined4 *)((long)dest + 4) = uVar3;
    *(undefined4 *)((long)dest + 8) = uVar3;
    *(undefined4 *)((long)dest + 0xc) = uVar3;
    dest = (void *)((long)dest + 0x10);
  }
  for (uVar1 = 0; ((uint)(bytesize >> 1) & 7) != uVar1; uVar1 = uVar1 + 1) {
    *(u16 *)((long)dest + uVar1 * 2) = value;
  }
  return;
}

Assistant:

inline void memset16(void *dest, const u16 value, size_t bytesize)
{
	u16 *d = (u16 *)dest;

	size_t i;

	// loops unrolled to reduce the number of increments by factor ~8.
	i = bytesize >> (1 + 3);
	while (i) {
		d[0] = value;
		d[1] = value;
		d[2] = value;
		d[3] = value;

		d[4] = value;
		d[5] = value;
		d[6] = value;
		d[7] = value;

		d += 8;
		--i;
	}

	i = (bytesize >> 1) & 7;
	while (i) {
		d[0] = value;
		++d;
		--i;
	}
}